

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

undefined8 __thiscall
VectorInstance::op_last
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  size_type sVar2;
  undefined8 *puVar3;
  int *piVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  allocator_type *in_RSI;
  undefined8 in_RDI;
  allocator_type *this_00;
  int n;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_fffffffffffffef8;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff30;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  IntegerInstance *in_stack_ffffffffffffff50;
  int local_84 [7];
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff98;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  IntegerInstance::IntegerInstance(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  iVar1 = IntegerInstance::value((IntegerInstance *)(local_84 + 1));
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bfcf2);
  local_1c = iVar1;
  if (iVar1 < 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  this_00 = in_RSI + 0x78;
  sVar2 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::size
                    ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                      *)this_00);
  local_84[0] = (int)sVar2;
  piVar4 = std::min<int>(&local_1c,local_84);
  local_1c = *piVar4;
  std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
            (in_stack_fffffffffffffef8);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  ::operator-(in_stack_ffffffffffffff08,(difference_type)this_00);
  std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
            (in_stack_fffffffffffffef8);
  std::allocator<std::shared_ptr<Instance>_>::allocator
            ((allocator<std::shared_ptr<Instance>_> *)0x1bfdaa);
  std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>::
  vector<__gnu_cxx::__normal_iterator<std::shared_ptr<Instance>*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_RSI);
  vector_representation_abi_cxx11_(in_stack_ffffffffffffff98);
  std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::~vector
            ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff10));
  std::allocator<std::shared_ptr<Instance>_>::~allocator
            ((allocator<std::shared_ptr<Instance>_> *)0x1bfdea);
  return in_RDI;
}

Assistant:

std::string VectorInstance::op_last(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return vector_representation(std::vector<std::shared_ptr<Instance>>(_value.end() - n, _value.end()));
}